

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O0

void __thiscall WorldShuffler::randomize_fox_hints(WorldShuffler *this)

{
  HintSource *this_00;
  byte bVar1;
  bool bVar2;
  uint16_t uVar3;
  vector<HintSource_*,_std::allocator<HintSource_*>_> *pvVar4;
  reference ppHVar5;
  size_type sVar6;
  LandstalkerException *this_01;
  reference ppHVar7;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  HintSource *local_170;
  HintSource *hint_source_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<HintSource_*,_std::allocator<HintSource_*>_> *__range1_1;
  string local_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  __normal_iterator<HintSource_*const_*,_std::vector<HintSource_*,_std::allocator<HintSource_*>_>_>
  local_88;
  HintSource **local_80;
  __normal_iterator<HintSource_*const_*,_std::vector<HintSource_*,_std::allocator<HintSource_*>_>_>
  local_78;
  __normal_iterator<HintSource_*const_*,_std::vector<HintSource_*,_std::allocator<HintSource_*>_>_>
  local_70;
  HintSource *local_68;
  HintSource *hint_source;
  const_iterator __end1;
  const_iterator __begin1;
  vector<HintSource_*,_std::allocator<HintSource_*>_> *__range1;
  vector<HintSource_*,_std::allocator<HintSource_*>_> foxes_pool;
  ushort local_18;
  ushort local_16;
  ushort local_14;
  uint16_t remaining_joke_hints;
  uint16_t remaining_item_location_hints;
  uint16_t remaining_dark_region_hints;
  uint16_t remaining_region_requirement_hints;
  uint16_t remaining_item_requirement_hints;
  WorldShuffler *this_local;
  
  bVar1 = RandomizerOptions::hints_distribution_item_requirement(this->_options);
  remaining_joke_hints = (uint16_t)bVar1;
  bVar1 = RandomizerOptions::hints_distribution_region_requirement(this->_options);
  local_14 = (ushort)bVar1;
  bVar1 = RandomizerOptions::hints_distribution_dark_region(this->_options);
  local_16 = (ushort)bVar1;
  bVar1 = RandomizerOptions::hints_distribution_item_location(this->_options);
  local_18 = (ushort)bVar1;
  bVar1 = RandomizerOptions::hints_distribution_joke(this->_options);
  foxes_pool.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_2_ = (ushort)bVar1;
  std::vector<HintSource_*,_std::allocator<HintSource_*>_>::vector
            ((vector<HintSource_*,_std::allocator<HintSource_*>_> *)&__range1);
  pvVar4 = RandomizerWorld::hint_sources(this->_world);
  __end1 = std::vector<HintSource_*,_std::allocator<HintSource_*>_>::begin(pvVar4);
  hint_source = (HintSource *)std::vector<HintSource_*,_std::allocator<HintSource_*>_>::end(pvVar4);
  while (bVar2 = __gnu_cxx::
                 operator==<HintSource_*const_*,_std::vector<HintSource_*,_std::allocator<HintSource_*>_>_>
                           (&__end1,(__normal_iterator<HintSource_*const_*,_std::vector<HintSource_*,_std::allocator<HintSource_*>_>_>
                                     *)&hint_source), ((bVar2 ^ 0xffU) & 1) != 0) {
    ppHVar5 = __gnu_cxx::
              __normal_iterator<HintSource_*const_*,_std::vector<HintSource_*,_std::allocator<HintSource_*>_>_>
              ::operator*(&__end1);
    local_68 = *ppHVar5;
    pvVar4 = RandomizerWorld::used_hint_sources(this->_world);
    local_78._M_current =
         (HintSource **)std::vector<HintSource_*,_std::allocator<HintSource_*>_>::begin(pvVar4);
    pvVar4 = RandomizerWorld::used_hint_sources(this->_world);
    local_80 = (HintSource **)std::vector<HintSource_*,_std::allocator<HintSource_*>_>::end(pvVar4);
    local_70 = std::
               find<__gnu_cxx::__normal_iterator<HintSource*const*,std::vector<HintSource*,std::allocator<HintSource*>>>,HintSource*>
                         (local_78,(__normal_iterator<HintSource_*const_*,_std::vector<HintSource_*,_std::allocator<HintSource_*>_>_>
                                    )local_80,&local_68);
    pvVar4 = RandomizerWorld::used_hint_sources(this->_world);
    local_88._M_current =
         (HintSource **)std::vector<HintSource_*,_std::allocator<HintSource_*>_>::end(pvVar4);
    bVar2 = __gnu_cxx::
            operator==<HintSource_*const_*,_std::vector<HintSource_*,_std::allocator<HintSource_*>_>_>
                      (&local_70,&local_88);
    if ((((bVar2 ^ 0xffU) & 1) == 0) && (bVar2 = HintSource::special(local_68), !bVar2)) {
      std::vector<HintSource*,std::allocator<HintSource*>>::emplace_back<HintSource*&>
                ((vector<HintSource*,std::allocator<HintSource*>> *)&__range1,&local_68);
    }
    __gnu_cxx::
    __normal_iterator<HintSource_*const_*,_std::vector<HintSource_*,_std::allocator<HintSource_*>_>_>
    ::operator++(&__end1);
  }
  vectools::shuffle<HintSource*>
            ((vector<HintSource_*,_std::allocator<HintSource_*>_> *)&__range1,&this->_rng);
  uVar3 = RandomizerOptions::hints_count(this->_options);
  sVar6 = std::vector<HintSource_*,_std::allocator<HintSource_*>_>::size
                    ((vector<HintSource_*,_std::allocator<HintSource_*>_> *)&__range1);
  if (uVar3 <= sVar6) {
    uVar3 = RandomizerOptions::hints_count(this->_options);
    std::vector<HintSource_*,_std::allocator<HintSource_*>_>::resize
              ((vector<HintSource_*,_std::allocator<HintSource_*>_> *)&__range1,(ulong)uVar3);
    __end1_1 = std::vector<HintSource_*,_std::allocator<HintSource_*>_>::begin
                         ((vector<HintSource_*,_std::allocator<HintSource_*>_> *)&__range1);
    hint_source_1 =
         (HintSource *)
         std::vector<HintSource_*,_std::allocator<HintSource_*>_>::end
                   ((vector<HintSource_*,_std::allocator<HintSource_*>_> *)&__range1);
    while (bVar2 = __gnu_cxx::
                   operator==<HintSource_**,_std::vector<HintSource_*,_std::allocator<HintSource_*>_>_>
                             (&__end1_1,
                              (__normal_iterator<HintSource_**,_std::vector<HintSource_*,_std::allocator<HintSource_*>_>_>
                               *)&hint_source_1), ((bVar2 ^ 0xffU) & 1) != 0) {
      ppHVar7 = __gnu_cxx::
                __normal_iterator<HintSource_**,_std::vector<HintSource_*,_std::allocator<HintSource_*>_>_>
                ::operator*(&__end1_1);
      local_170 = *ppHVar7;
      RandomizerWorld::add_used_hint_source(this->_world,local_170);
      if ((local_16 == 0) || (bVar2 = generate_dark_region_hint(this,local_170), !bVar2)) {
        if ((remaining_joke_hints == 0) ||
           (bVar2 = generate_item_requirement_hint(this,local_170), !bVar2)) {
          if ((local_14 == 0) || (bVar2 = generate_region_requirement_hint(this,local_170), !bVar2))
          {
            if ((local_18 == 0) || (bVar2 = generate_item_location_hint(this,local_170), !bVar2)) {
              this_00 = local_170;
              if (foxes_pool.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage._6_2_ == 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1b8,"I was meant to say something but... I forgot.",
                           &local_1b9);
                HintSource::text(this_00,&local_1b8);
                std::__cxx11::string::~string((string *)&local_1b8);
                std::allocator<char>::~allocator(&local_1b9);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_190,"I don\'t have anything to tell you. Move on.",
                           &local_191);
                HintSource::text(this_00,&local_190);
                std::__cxx11::string::~string((string *)&local_190);
                std::allocator<char>::~allocator(&local_191);
                foxes_pool.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._6_2_ =
                     foxes_pool.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ - 1;
              }
            }
            else {
              local_18 = local_18 - 1;
            }
          }
          else {
            local_14 = local_14 - 1;
          }
        }
        else {
          remaining_joke_hints = remaining_joke_hints - 1;
        }
      }
      else {
        local_16 = local_16 - 1;
      }
      __gnu_cxx::
      __normal_iterator<HintSource_**,_std::vector<HintSource_*,_std::allocator<HintSource_*>_>_>::
      operator++(&__end1_1);
    }
    std::vector<HintSource_*,_std::allocator<HintSource_*>_>::~vector
              ((vector<HintSource_*,_std::allocator<HintSource_*>_> *)&__range1);
    return;
  }
  this_01 = (LandstalkerException *)__cxa_allocate_exception(0x28);
  uVar3 = RandomizerOptions::hints_count(this->_options);
  std::__cxx11::to_string(&local_128,(uint)uVar3);
  std::operator+(&local_108,"Hints count (",&local_128);
  std::operator+(&local_e8,&local_108,") is bigger than foxes pool size (");
  sVar6 = std::vector<HintSource_*,_std::allocator<HintSource_*>_>::size
                    ((vector<HintSource_*,_std::allocator<HintSource_*>_> *)&__range1);
  std::__cxx11::to_string(&local_148,sVar6);
  std::operator+(&local_c8,&local_e8,&local_148);
  std::operator+(&local_a8,&local_c8,").");
  LandstalkerException::LandstalkerException(this_01,&local_a8);
  __cxa_throw(this_01,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException);
}

Assistant:

void WorldShuffler::randomize_fox_hints()
{
    uint16_t remaining_item_requirement_hints = _options.hints_distribution_item_requirement();
    uint16_t remaining_region_requirement_hints = _options.hints_distribution_region_requirement();
    uint16_t remaining_dark_region_hints = _options.hints_distribution_dark_region();
    uint16_t remaining_item_location_hints = _options.hints_distribution_item_location();
    uint16_t remaining_joke_hints = _options.hints_distribution_joke();

    std::vector<HintSource*> foxes_pool;
    for(HintSource* hint_source : _world.hint_sources())
    {
        if(std::find(_world.used_hint_sources().begin(), _world.used_hint_sources().end(), hint_source) != _world.used_hint_sources().end())
            continue;
        if(hint_source->special())
            continue;

        foxes_pool.emplace_back(hint_source);
    }

    vectools::shuffle(foxes_pool, _rng);

    if(_options.hints_count() > foxes_pool.size())
    {
        throw LandstalkerException("Hints count (" + std::to_string(_options.hints_count())
                                   + ") is bigger than foxes pool size (" + std::to_string(foxes_pool.size()) +").");
    }
    foxes_pool.resize(_options.hints_count());

    // Put hints inside
    for(HintSource* hint_source : foxes_pool)
    {
        _world.add_used_hint_source(hint_source);

        if(remaining_dark_region_hints > 0)
        {
            if(this->generate_dark_region_hint(hint_source))
            {
                remaining_dark_region_hints--;
                continue;
            }
        }
        if(remaining_item_requirement_hints > 0)
        {
            if(this->generate_item_requirement_hint(hint_source))
            {
                remaining_item_requirement_hints--;
                continue;
            }
        }
        if(remaining_region_requirement_hints > 0)
        {
            if(this->generate_region_requirement_hint(hint_source))
            {
                remaining_region_requirement_hints--;
                continue;
            }
        }
        if(remaining_item_location_hints > 0)
        {
            if(this->generate_item_location_hint(hint_source))
            {
                remaining_item_location_hints--;
                continue;
            }
        }
        if(remaining_joke_hints > 0)
        {
            hint_source->text("I don't have anything to tell you. Move on.");
            remaining_joke_hints--;
            continue;
        }

        // Fallback if none of the options above were matching
        hint_source->text("I was meant to say something but... I forgot.");
    }
}